

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  unfinished_tasks_test_params_class *this;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<int> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  allocator local_30a;
  allocator_type local_309;
  string local_308;
  TestArgsWrapper unfinished_tasks_test_params;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  TestSuite test;
  TestRange<int> local_190;
  TestRange<unsigned_long> local_160;
  TestRange<unsigned_long> local_128;
  TestRange<unsigned_long> local_f0;
  TestRange<unsigned_long> local_b8;
  TestRange<unsigned_long> local_80;
  TestRange<unsigned_long> local_48;
  
  TestSuite::TestSuite(&test,argc,argv);
  test.options.printTestMessage = true;
  std::__cxx11::string::string((string *)&local_208,"basic test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l._M_len = 3;
  __l._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&test,&local_208,basic_test,&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_48.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string((string *)&local_228,"recurring test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_00,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_80,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&test,&local_228,recurring_test,&local_80);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_80.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_248,"relay test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_01,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_b8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&test,&local_248,relay_test,&local_b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_b8.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string((string *)&local_268,"fast relay test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x100000000;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_308,__l_02,(allocator_type *)&local_309);
  TestRange<int>::TestRange(&local_190,(vector<int,_std::allocator<int>_> *)&local_308);
  TestSuite::doTest<int,int(*)(int)>(&test,&local_268,fast_relay_test,&local_190);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_190.array.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string((string *)&local_288,"reschedule one time test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_03,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_f0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&test,&local_288,reschedule_one_time_test,&local_f0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_f0.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string((string *)&local_2a8,"reschedule recurring test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_04,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_128,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&test,&local_2a8,reschedule_recurring_test,&local_128);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_128.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2c8,"mixed test",&local_30a);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)0x0;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&unfinished_tasks_test_params;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_05,&local_309);
  TestRange<unsigned_long>::TestRange
            (&local_160,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&test,&local_2c8,mixed_test,&local_160);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_160.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  std::__cxx11::string::~string((string *)&local_2c8);
  this = (unfinished_tasks_test_params_class *)operator_new(0xe0);
  unfinished_tasks_test_params_class::unfinished_tasks_test_params_class(this);
  unfinished_tasks_test_params.test_args = (TestArgsBase *)this;
  std::__cxx11::string::string((string *)&local_308,"unfinished tasks test",&local_30a);
  TestSuite::doTest<int(*)(TestArgsBase*)>
            (&test,&local_308,unfinished_tasks_test,&unfinished_tasks_test_params);
  std::__cxx11::string::~string((string *)&local_308);
  if (unfinished_tasks_test_params.test_args != (TestArgsBase *)0x0) {
    (*(unfinished_tasks_test_params.test_args)->_vptr_TestArgsBase[1])();
  }
  TestSuite::~TestSuite(&test);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);
    test.options.printTestMessage = true;

    test.doTest( "basic test",
                 basic_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    test.doTest( "recurring test",
                 recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "relay test",
                 relay_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "fast relay test",
                 fast_relay_test,
                 TestRange<int>( {0, 1, 2} ) );

    test.doTest( "reschedule one time test",
                 reschedule_one_time_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "reschedule recurring test",
                 reschedule_recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "mixed test",
                 mixed_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    SET_PARAMS(unfinished_tasks_test_params);
    test.doTest( "unfinished tasks test",
                 unfinished_tasks_test,
                 unfinished_tasks_test_params );

    return 0;
}